

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void ObsGetDiscard(pyhanabi_observation_t *observation,int index,pyhanabi_card_t *card)

{
  pyhanabi_card_t *ppVar1;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d7,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  if (observation->observation != (void *)0x0) {
    if (card != (pyhanabi_card_t *)0x0) {
      ppVar1 = (pyhanabi_card_t *)
               std::
               vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ::at((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                     *)((long)observation->observation + 0x20),(long)index);
      *card = *ppVar1;
      return;
    }
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d9,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x2d8,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
}

Assistant:

void ObsGetDiscard(pyhanabi_observation_t* observation, int index,
                   pyhanabi_card_t* card) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->DiscardPile()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}